

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

string * __thiscall
iDynTree::Visualizer::getModelInstanceName_abi_cxx11_(Visualizer *this,size_t modelInstanceIndex)

{
  char *pcVar1;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  allocator<char> local_2d [13];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *__s;
  
  __s = in_RDX;
  pcVar1 = (char *)getNrOfVisualizedModels((Visualizer *)in_RSI);
  if (in_RDX < pcVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,__s,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,__s,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

std::string Visualizer::getModelInstanceName(size_t modelInstanceIndex)
{
    if( modelInstanceIndex >= getNrOfVisualizedModels() )
    {
        return "";
    }

#ifdef IDYNTREE_USES_IRRLICHT
    return pimpl->m_modelViz->at(modelInstanceIndex)->getInstanceName();
#else
    return "";
#endif

}